

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

int Lodtalk::executeScriptFromFile
              (InterpreterProxy *interpreter,FILE *file,string *name,string *basePath)

{
  int iVar1;
  undefined4 extraout_var;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar2;
  Oop oop;
  Node *pNVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Ref<Lodtalk::ScriptContext> context;
  ASTInterpreter astInterpreter;
  EvaluationScopePtr local_b0;
  FILE *local_a0;
  anon_union_8_4_0eb573b0_for_Oop_0 local_98;
  VMContext *local_90;
  ASTInterpreter local_78;
  VMContext *this;
  
  local_a0 = file;
  iVar1 = (**interpreter->_vptr_InterpreterProxy)();
  this = (VMContext *)CONCAT44(extraout_var,iVar1);
  aVar2.header = VMContext::basicNativeNewFromClassIndex(this,0x62);
  local_98.pointer = (uint8_t *)&NilObject;
  local_90 = this;
  OopRef::registerSelf((OopRef *)&local_98);
  local_98.header = aVar2.header;
  if ((ObjectHeader *)aVar2.pointer == (ObjectHeader *)&NilObject) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
LAB_001393c6:
    OopRef::unregisterSelf((OopRef *)&local_98);
    return iVar1;
  }
  oop = VMContext::getGlobalContext(this);
  aVar2 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::getClassFromOop(this,oop);
  if ((ObjectHeader *)local_98.pointer != (ObjectHeader *)&NilObject) {
    *(anon_union_8_4_0eb573b0_for_Oop_0 *)(local_98.uintValue + 0x18) = aVar2;
    aVar2 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::makeByteString(this,basePath);
    if ((ObjectHeader *)local_98.pointer != (ObjectHeader *)&NilObject) {
      *(anon_union_8_4_0eb573b0_for_Oop_0 *)(local_98.uintValue + 0x20) = aVar2;
      pNVar3 = AST::parseSourceFromFile(this,local_a0);
      if (pNVar3 == (Node *)0x0) {
        iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
      }
      else {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
        this_00->_M_use_count = 1;
        this_00->_M_weak_count = 1;
        this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00164db8;
        local_b0.super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(this_00 + 1);
        this_00[1]._M_use_count = 0;
        this_00[1]._M_weak_count = 0;
        this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__EvaluationScope_001646b0;
        *(VMContext **)&this_00[2]._M_use_count = this;
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = 2;
        }
        local_b0.super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = this_00;
        ASTInterpreter::ASTInterpreter(&local_78,interpreter,&local_b0,(Oop)local_98);
        if (local_b0.super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b0.
                     super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        (*pNVar3->_vptr_Node[2])(pNVar3,&local_78);
        local_78.super_ScopedInterpreter.super_AbstractASTVisitor.super_ASTVisitor._vptr_ASTVisitor
             = (ASTVisitor)&PTR_visitArgument_00164770;
        OopRef::unregisterSelf(&local_78.currentSelf);
        local_78.super_ScopedInterpreter.super_AbstractASTVisitor.super_ASTVisitor._vptr_ASTVisitor
             = (ASTVisitor)&PTR___cxa_pure_virtual_001649d8;
        if (local_78.super_ScopedInterpreter.currentScope.
            super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.super_ScopedInterpreter.currentScope.
                     super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        iVar1 = 0;
      }
      goto LAB_001393c6;
    }
  }
  __assert_fail("!isNil()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                ,0x3bf,
                "T *Lodtalk::Ref<Lodtalk::ScriptContext>::operator->() const [T = Lodtalk::ScriptContext]"
               );
}

Assistant:

int executeScriptFromFile(InterpreterProxy *interpreter, FILE *file, const std::string &name, const std::string &basePath)
{
    // Create the script context
    auto vmContext = interpreter->getContext();
	Ref<ScriptContext> context(vmContext, reinterpret_cast<ScriptContext*> (vmContext->basicNativeNewFromClassIndex(SCI_ScriptContext)));
	if(context.isNil())
		return interpreter->primitiveFailed();

	context->globalContextClass = vmContext->getClassFromOop(vmContext->getGlobalContext());
	context->basePath = vmContext->makeByteString(basePath);

	// Parse the script.
	auto ast = Lodtalk::AST::parseSourceFromFile(vmContext, file);
	if(!ast)
		return interpreter->primitiveFailed();

	// Create the global scope
	auto scope = std::make_shared<GlobalEvaluationScope> (vmContext);

	// Interpret the script.
	ASTInterpreter astInterpreter(interpreter, scope, context.getOop());
	ast->acceptVisitor(&astInterpreter);

    return 0;
}